

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::
Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
::walkModule(Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
             *this,Module *module)

{
  Unsubtyping *this_00;
  pointer puVar1;
  Function *__args;
  long *plVar2;
  Expression *sub;
  Type sub_00;
  long *plVar3;
  undefined8 *puVar4;
  Module *pMVar5;
  undefined8 uVar6;
  mapped_type *__args_1;
  _Rb_tree_node_base *p_Var7;
  Table *pTVar8;
  long *plVar9;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar10;
  _Base_ptr p_Var11;
  long *plVar12;
  undefined8 *puVar13;
  long lVar14;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_1;
  _Base_ptr p_Var15;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  undefined1 local_330 [8];
  PassRunner runner;
  function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)> local_e0;
  function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)> local_c0;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  Module *local_80;
  ParallelFunctionAnalysis<wasm::(anonymous_namespace)::Unsubtyping,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *seg;
  
  this->currModule = module;
  this_00 = (Unsubtyping *)(this[-1].stack.fixed._M_elems + 7);
  local_a0._8_8_ = 0;
  local_a0._M_unused._M_object = &analysis.field_0x30;
  local_88 = std::
             _Function_handler<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Unsubtyping.cpp:349:14)>
             ::_M_invoke;
  analysis._24_8_ = &analysis.field_0x8;
  analysis._8_4_ = 0;
  analysis._16_8_ = 0;
  analysis._40_8_ = 0;
  local_90 = std::
             _Function_handler<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Unsubtyping.cpp:349:14)>
             ::_M_manager;
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_80 = module;
  analysis._32_8_ = analysis._24_8_;
  analysis._48_8_ = module;
  for (puVar10 = (module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar1; puVar10 = puVar10 + 1
      ) {
    runner._232_8_ =
         (puVar10->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
         ._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    std::
    map<wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
    ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
                  *)&analysis,(key_type *)&runner.isNested);
  }
  std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)>::function
            (&local_c0,
             (function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)> *)
             &local_a0);
  puVar1 = (local_80->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar10 = (local_80->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar1; puVar10 = puVar10 + 1
      ) {
    __args = (puVar10->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(__args->super_Importable).module + 8) != (char *)0x0) {
      runner._232_8_ = __args;
      __args_1 = std::
                 map<wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
                 ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
                               *)&analysis,(key_type *)&runner.isNested);
      std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)>::operator()
                (&local_c0,__args,__args_1);
    }
  }
  PassRunner::PassRunner((PassRunner *)local_330,local_80);
  pMVar5 = local_80;
  std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)>::function
            (&local_e0,&local_c0);
  wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::Unsubtyping,(wasm::
  Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,wasm::
  (anonymous_namespace)::Unsubtyping&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::Function*,wasm
  ::(anonymous_namespace)::Unsubtyping,std::less<wasm::Function*>,std::allocator<std::pair<wasm::
  Function*const,wasm::(anonymous_namespace)::Unsubtyping>>>&,std::function<void(wasm::
  Function*,wasm::(anonymous)::Unsubtyping__>_
            (&runner.isNested,pMVar5,(Map *)&analysis,(Func *)&local_e0);
  pMVar5 = local_80;
  Pass::setPassRunner((Pass *)&runner.isNested,(PassRunner *)local_330);
  (**(code **)(runner._232_8_ + 0x10))(&runner.isNested,pMVar5);
  ::anon_func::Mapper::~Mapper((Mapper *)&runner.isNested);
  std::_Function_base::~_Function_base(&local_e0.super__Function_base);
  PassRunner::~PassRunner((PassRunner *)local_330);
  std::_Function_base::~_Function_base(&local_c0.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_a0);
  for (p_Var7 = (_Rb_tree_node_base *)analysis._24_8_;
      p_Var7 != (_Rb_tree_node_base *)&analysis.field_0x8;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    p_Var11 = (_Base_ptr)&p_Var7[0xe]._M_right;
    while (p_Var11 = *(_Base_ptr *)p_Var11, p_Var11 != (_Base_ptr)0x0) {
      anon_unknown_22::Unsubtyping::noteSubtype
                (this_00,(HeapType)p_Var11->_M_parent,(HeapType)p_Var11->_M_left);
    }
    p_Var11 = (_Base_ptr)&p_Var7[0x10]._M_left;
    while (p_Var11 = *(_Base_ptr *)p_Var11, p_Var11 != (_Base_ptr)0x0) {
      p_Var15 = p_Var11 + 1;
      while (p_Var15 = *(_Base_ptr *)p_Var15, p_Var15 != (_Base_ptr)0x0) {
        anon_unknown_22::Unsubtyping::noteCast
                  (this_00,(HeapType)p_Var11->_M_parent,(HeapType)p_Var15->_M_parent);
      }
    }
  }
  plVar2 = *(long **)(analysis._48_8_ + 0x38);
  for (plVar9 = *(long **)(analysis._48_8_ + 0x30); plVar9 != plVar2; plVar9 = plVar9 + 1) {
    sub = *(Expression **)(*plVar9 + 0x40);
    if (sub != (Expression *)0x0) {
      anon_unknown_22::Unsubtyping::noteSubtype(this_00,sub,(Type)*(uintptr_t *)(*plVar9 + 0x38));
    }
  }
  plVar2 = *(long **)(analysis._48_8_ + 0x68);
  for (plVar9 = *(long **)(analysis._48_8_ + 0x60); uVar6 = analysis._48_8_, plVar9 != plVar2;
      plVar9 = plVar9 + 1) {
    lVar14 = *plVar9;
    if (*(long *)(lVar14 + 0x28) != 0) {
      sub_00.id = *(uintptr_t *)(lVar14 + 0x30);
      pTVar8 = Module::getTable(this->currModule,(Name)((IString *)(lVar14 + 0x18))->str);
      anon_unknown_22::Unsubtyping::noteSubtype(this_00,sub_00,(Type)(pTVar8->type).id);
    }
    plVar3 = *(long **)(lVar14 + 0x40);
    for (plVar12 = *(long **)(lVar14 + 0x38); plVar12 != plVar3; plVar12 = plVar12 + 1) {
      anon_unknown_22::Unsubtyping::noteSubtype
                (this_00,(Type)*(uintptr_t *)(*plVar12 + 8),(Type)*(uintptr_t *)(lVar14 + 0x30));
    }
  }
  this->currModule = (Module *)analysis._48_8_;
  plVar2 = *(long **)(analysis._48_8_ + 0x38);
  for (plVar9 = *(long **)(analysis._48_8_ + 0x30); plVar9 != plVar2; plVar9 = plVar9 + 1) {
    if (*(long *)(*plVar9 + 0x20) == 0) {
      walk(this,(Expression **)(*plVar9 + 0x40));
    }
  }
  plVar2 = *(long **)(uVar6 + 0x68);
  for (plVar9 = *(long **)(uVar6 + 0x60); plVar9 != plVar2; plVar9 = plVar9 + 1) {
    lVar14 = *plVar9;
    if (*(long *)(lVar14 + 0x28) != 0) {
      walk(this,(Expression **)(lVar14 + 0x28));
      lVar14 = *plVar9;
    }
    puVar4 = *(undefined8 **)(lVar14 + 0x40);
    for (puVar13 = *(undefined8 **)(lVar14 + 0x38); puVar13 != puVar4; puVar13 = puVar13 + 1) {
      runner._232_8_ = *puVar13;
      walk(this,(Expression **)&runner.isNested);
    }
  }
  plVar2 = *(long **)(uVar6 + 0x98);
  for (plVar9 = *(long **)(uVar6 + 0x90); plVar9 != plVar2; plVar9 = plVar9 + 1) {
    if (*(long *)(*plVar9 + 0x30) != 0) {
      walk(this,(Expression **)(*plVar9 + 0x30));
    }
  }
  this->currModule = (Module *)0x0;
  std::
  map<wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
  ::~map((map<wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
          *)&analysis);
  this->currModule = (Module *)0x0;
  return;
}

Assistant:

void walkModule(Module* module) {
    setModule(module);
    static_cast<SubType*>(this)->doWalkModule(module);
    static_cast<SubType*>(this)->visitModule(module);
    setModule(nullptr);
  }